

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> * __thiscall
kratos::FSM::get_all_child_states
          (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__return_storage_ptr__,
          FSM *this,bool include_extra_state)

{
  _Map_pointer *__args;
  FSM *pFVar1;
  pointer ppVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pair<kratos::Var_*,_kratos::FSMState_*> *iter;
  FSMState *pFVar6;
  pointer *__k;
  undefined1 local_e8 [8];
  unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
  visited;
  queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
  queue;
  FSMState *next_state;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  next_states;
  FSMState *state;
  
  std::queue<kratos::FSMState*,std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>>::
  queue<std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>,void>
            ((queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
              *)&visited._M_h._M_single_bucket);
  (__return_storage_ptr__->
  super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  for (p_Var3 = (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->states_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    next_state = *(FSMState **)(p_Var3 + 2);
    std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>::emplace_back<kratos::FSMState*>
              ((deque<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
               &visited._M_h._M_single_bucket,&next_state);
  }
  __args = &queue.c.super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  do {
    do {
      do {
        __k = &next_states.
               super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (queue.c.super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node ==
            (_Map_pointer)
            queue.c.super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Deque_impl_data._M_map_size) {
          std::
          _Hashtable<kratos::FSMState_*,_kratos::FSMState_*,_std::allocator<kratos::FSMState_*>,_std::__detail::_Identity,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<kratos::FSMState_*,_kratos::FSMState_*,_std::allocator<kratos::FSMState_*>,_std::__detail::_Identity,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_e8);
          std::_Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~_Deque_base
                    ((_Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                     &visited._M_h._M_single_bucket);
          return __return_storage_ptr__;
        }
        next_states.
        super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              queue.c.super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Deque_impl_data._M_map_size;
        std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::pop_front
                  ((deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
                   &visited._M_h._M_single_bucket);
        iVar4 = std::
                _Hashtable<kratos::FSMState_*,_kratos::FSMState_*,_std::allocator<kratos::FSMState_*>,_std::__detail::_Identity,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find((_Hashtable<kratos::FSMState_*,_kratos::FSMState_*,_std::allocator<kratos::FSMState_*>,_std::__detail::_Identity,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_e8,(key_type *)__k);
      } while (iVar4.super__Node_iterator_base<kratos::FSMState_*,_false>._M_cur !=
               (__node_type *)0x0);
      std::
      _Hashtable<kratos::FSMState*,kratos::FSMState*,std::allocator<kratos::FSMState*>,std::__detail::_Identity,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<kratos::FSMState*const&>
                ((_Hashtable<kratos::FSMState*,kratos::FSMState*,std::allocator<kratos::FSMState*>,std::__detail::_Identity,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_e8,__k);
      std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
      emplace_back<kratos::FSMState*const&>
                ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
                 __return_storage_ptr__,(FSMState **)__k);
    } while (next_states.
             super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0);
    std::
    vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ::vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              *)&next_state,
             (vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              *)&next_states.
                 super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second);
    ppVar2 = next_states.
             super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pFVar6 = next_state; pFVar6 != (FSMState *)ppVar2; pFVar6 = (FSMState *)&pFVar6->name_) {
      queue.c.super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node =
           (_Map_pointer)
           (pFVar6->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
           super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)queue.c.
                      super__Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node + 0x30);
      do {
        pFVar1 = (FSM *)p_Var5->_vptr__Sp_counted_base;
        if (pFVar1 == (FSM *)0x0) break;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pFVar1->parent_fsm_;
      } while (pFVar1 != this);
      if (pFVar1 == this) {
        std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
        emplace_back<kratos::FSMState*&>
                  ((deque<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
                   &visited._M_h._M_single_bucket,(FSMState **)__args);
      }
      else if (include_extra_state) {
        std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
        emplace_back<kratos::FSMState*&>
                  ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
                   __return_storage_ptr__,(FSMState **)__args);
      }
    }
    std::
    _Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                     *)&next_state);
  } while( true );
}

Assistant:

std::vector<FSMState*> FSM::get_all_child_states(bool include_extra_state) const {
    // this is a BFS search
    std::queue<FSMState*> queue;
    std::vector<FSMState*> result;
    std::unordered_set<FSMState*> visited;

    for (auto const& iter : states_) {
        queue.emplace(iter.second.get());
    }
    while (!queue.empty()) {
        auto* const state = queue.front();
        queue.pop();
        if (visited.find(state) != visited.end()) continue;
        visited.emplace(state);
        result.emplace_back(state);
        if (!state) continue;
        auto next_states = state->transitions();
        for (auto const& iter : next_states) {
            auto* next_state = iter.second;
            auto const* fsm = next_state->parent();
            while (fsm && fsm != this) {
                fsm = fsm->parent_fsm();
            }
            if (fsm == this) {
                queue.emplace(next_state);
            } else if (include_extra_state) {
                result.emplace_back(next_state);
            }
        }
    }
    return result;
}